

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O3

void * TrainModelThread(void *id)

{
  size_t __n;
  char cVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  real *prVar5;
  longlong lVar6;
  vocab_word *pvVar7;
  real *prVar8;
  real *prVar9;
  real *prVar10;
  int iVar11;
  int iVar12;
  void *__ptr;
  void *__ptr_00;
  FILE *__stream;
  long lVar13;
  clock_t cVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  void *pvVar29;
  float fVar30;
  double dVar31;
  longlong sen [1001];
  long local_1fd8;
  longlong local_1fc8;
  long alStack_1f78 [1001];
  
  lVar6 = layer1_size;
  local_1fc8 = iter;
  __ptr = calloc(layer1_size,4);
  __ptr_00 = calloc(lVar6,4);
  printf("Opening train file %s\n",train_file);
  __stream = fopen(train_file,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"no such file or directory: %s",train_file);
    exit(1);
  }
  pvVar29 = id;
  if ((long)num_threads < 2) {
    lVar20 = 0;
    goto LAB_00103632;
  }
  lVar13 = file_size / (long)num_threads;
  lVar20 = 0;
LAB_0010361f:
  fseek(__stream,lVar13 * (long)id,0);
LAB_00103632:
  lVar28 = 0;
  local_1fd8 = 0;
  lVar13 = 0;
  do {
    if (10000 < lVar28 - local_1fd8) {
      word_count_actual = (lVar28 - local_1fd8) + word_count_actual;
      if (1 < debug_mode) {
        cVar14 = clock();
        printf("%cAlpha: %f  Progress: %.2f%%  Words/thread/sec: %.2fk  ",(double)alpha,
               (double)(((float)word_count_actual / (float)(train_words * iter + 1)) * 100.0),
               (double)((float)word_count_actual /
                       (((float)((cVar14 - start) + 1) / 1e+06) * 1000.0)));
        fflush(_stdout);
      }
      alpha = (1.0 - (float)word_count_actual / (float)(train_words * iter + 1)) * starting_alpha;
      local_1fd8 = lVar28;
      if (alpha < starting_alpha * 0.0001) {
        alpha = starting_alpha * 0.0001;
      }
    }
    if (lVar13 == 0) {
      lVar15 = 0;
LAB_0010379f:
      do {
        do {
          lVar13 = lVar15;
          iVar11 = ReadWordIndex((FILE *)__stream);
          iVar12 = feof(__stream);
          if (iVar12 != 0) {
LAB_001038c3:
            lVar20 = 0;
            goto LAB_001038cd;
          }
          lVar15 = lVar13;
        } while (iVar11 == -1);
        lVar28 = lVar28 + 1;
        if (iVar11 == 0) goto LAB_001038c3;
        lVar20 = (long)iVar11;
        if (0.0 < sample) {
          dVar31 = (double)((float)vocab[lVar20].cn / (sample * (float)train_words));
          if (dVar31 < 0.0) {
            dVar31 = sqrt(dVar31);
          }
          else {
            dVar31 = SQRT(dVar31);
          }
          pvVar29 = (void *)((long)pvVar29 * 0x5deece66d + 0xb);
          if ((float)(((double)((float)train_words * sample) * (dVar31 + 1.0)) /
                     (double)vocab[lVar20].cn) < (float)((uint)pvVar29 & 0xffff) * 1.5258789e-05)
          goto LAB_0010379f;
        }
        alStack_1f78[lVar13] = lVar20;
        lVar15 = lVar13 + 1;
        lVar13 = 1000;
        lVar20 = 0;
      } while (lVar15 != 1000);
    }
LAB_001038cd:
    iVar11 = feof(__stream);
    lVar6 = layer1_size;
    if ((iVar11 != 0) || (train_words / (long)num_threads < lVar28)) break;
    lVar15 = alStack_1f78[lVar20];
    if (lVar15 != -1) {
      if (0 < layer1_size) {
        __n = layer1_size * 4;
        memset(__ptr,0,__n);
        memset(__ptr_00,0,__n);
      }
      prVar5 = syn0;
      pvVar7 = vocab;
      iVar12 = hs;
      iVar11 = negative;
      pvVar29 = (void *)((long)pvVar29 * 0x5deece66d + 0xb);
      uVar25 = (ulong)window;
      uVar18 = (ulong)pvVar29 % uVar25;
      lVar22 = (uVar25 * 2 + 1) - uVar18;
      if (cbow == 0) {
        if ((long)uVar18 < lVar22) {
          uVar27 = negative + 1;
          do {
            if ((((uVar18 != uVar25) && (lVar16 = uVar18 + (lVar20 - uVar25), -1 < lVar16)) &&
                (lVar16 < lVar13)) && (lVar16 = alStack_1f78[lVar16], lVar16 != -1)) {
              if (0 < lVar6) {
                memset(__ptr_00,0,lVar6 * 4);
              }
              prVar10 = expTable;
              prVar9 = syn1;
              prVar8 = syn0;
              lVar16 = lVar16 * lVar6;
              if ((iVar12 != 0) && (cVar1 = pvVar7[lVar15].codelen, 0 < (long)cVar1)) {
                piVar2 = pvVar7[lVar15].point;
                lVar21 = 0;
                do {
                  lVar23 = piVar2[lVar21] * lVar6;
                  if (lVar6 < 1) {
                    fVar30 = 0.0;
                  }
                  else {
                    fVar30 = 0.0;
                    lVar26 = 0;
                    do {
                      fVar30 = fVar30 + prVar8[lVar16 + lVar26] * prVar9[lVar23 + lVar26];
                      lVar26 = lVar26 + 1;
                    } while (lVar6 != lVar26);
                  }
                  if ((ABS(fVar30) < 6.0) && (0 < lVar6)) {
                    fVar30 = ((float)(1 - pvVar7[lVar15].code[lVar21]) -
                             prVar10[(int)((fVar30 + 6.0) * 83.0)]) * alpha;
                    lVar26 = 0;
                    do {
                      *(float *)((long)__ptr_00 + lVar26 * 4) =
                           prVar9[lVar23 + lVar26] * fVar30 +
                           *(float *)((long)__ptr_00 + lVar26 * 4);
                      lVar26 = lVar26 + 1;
                    } while (lVar6 != lVar26);
                    if (0 < lVar6) {
                      lVar26 = 0;
                      do {
                        prVar9[lVar23 + lVar26] =
                             prVar8[lVar16 + lVar26] * fVar30 + prVar9[lVar23 + lVar26];
                        lVar26 = lVar26 + 1;
                      } while (lVar6 != lVar26);
                    }
                  }
                  lVar21 = lVar21 + 1;
                } while (lVar21 != cVar1);
              }
              prVar10 = expTable;
              prVar9 = syn1neg;
              prVar8 = syn0;
              piVar2 = table;
              if (0 < iVar11) {
                uVar19 = vocab_size - 1;
                uVar24 = 0;
                do {
                  if (uVar24 == 0) {
                    iVar17 = 1;
                    lVar21 = lVar15;
LAB_00104020:
                    lVar21 = lVar21 * lVar6;
                    fVar30 = 0.0;
                    if (lVar6 < 1) {
LAB_00104068:
                      fVar30 = (float)iVar17 - prVar10[(int)((fVar30 + 6.0) * 83.0)];
                    }
                    else {
                      lVar23 = 0;
                      fVar30 = 0.0;
                      do {
                        fVar30 = fVar30 + prVar8[lVar16 + lVar23] * prVar9[lVar21 + lVar23];
                        lVar23 = lVar23 + 1;
                      } while (lVar6 != lVar23);
                      if (fVar30 <= 6.0) {
                        if (-6.0 <= fVar30) goto LAB_00104068;
                      }
                      else {
                        iVar17 = iVar17 + -1;
                      }
                      fVar30 = (float)iVar17;
                    }
                    fVar30 = fVar30 * alpha;
                    if (0 < lVar6) {
                      lVar23 = 0;
                      do {
                        *(float *)((long)__ptr_00 + lVar23 * 4) =
                             prVar9[lVar21 + lVar23] * fVar30 +
                             *(float *)((long)__ptr_00 + lVar23 * 4);
                        lVar23 = lVar23 + 1;
                      } while (lVar6 != lVar23);
                      if (0 < lVar6) {
                        lVar23 = 0;
                        do {
                          prVar9[lVar21 + lVar23] =
                               prVar8[lVar16 + lVar23] * fVar30 + prVar9[lVar21 + lVar23];
                          lVar23 = lVar23 + 1;
                        } while (lVar6 != lVar23);
                      }
                    }
                  }
                  else {
                    pvVar29 = (void *)((long)pvVar29 * 0x5deece66d + 0xb);
                    auVar4._8_8_ = 0;
                    auVar4._0_8_ = (ulong)pvVar29 >> 0x10;
                    lVar21 = (long)piVar2[(int)((ulong)pvVar29 >> 0x10) +
                                          (SUB164(auVar4 * ZEXT816(0x55e63b88c231),8) >> 9) *
                                          -100000000];
                    if (lVar21 == 0) {
                      lVar21 = (ulong)pvVar29 % uVar19 + 1;
                    }
                    if (lVar21 != lVar15) {
                      iVar17 = 0;
                      goto LAB_00104020;
                    }
                  }
                  uVar24 = uVar24 + 1;
                } while (uVar24 != uVar27);
              }
              if (0 < lVar6) {
                lVar21 = 0;
                do {
                  prVar5[lVar16 + lVar21] =
                       *(float *)((long)__ptr_00 + lVar21 * 4) + prVar5[lVar16 + lVar21];
                  lVar21 = lVar21 + 1;
                } while (lVar6 != lVar21);
              }
            }
            uVar18 = uVar18 + 1;
          } while ((long)uVar18 < lVar22);
        }
      }
      else if ((long)uVar18 < lVar22) {
        lVar16 = 0;
        uVar19 = uVar18;
        do {
          if ((((uVar19 != uVar25) && (lVar21 = uVar19 + (lVar20 - uVar25), -1 < lVar21)) &&
              (lVar21 < lVar13)) && (lVar21 = alStack_1f78[lVar21], lVar21 != -1)) {
            if (0 < lVar6) {
              lVar23 = 0;
              do {
                *(float *)((long)__ptr + lVar23 * 4) =
                     prVar5[lVar21 * lVar6 + lVar23] + *(float *)((long)__ptr + lVar23 * 4);
                lVar23 = lVar23 + 1;
              } while (lVar6 != lVar23);
            }
            lVar16 = lVar16 + 1;
          }
          uVar19 = uVar19 + 1;
        } while ((long)uVar19 < lVar22);
        if (lVar16 != 0) {
          if (0 < lVar6) {
            lVar21 = 0;
            do {
              *(float *)((long)__ptr + lVar21 * 4) =
                   *(float *)((long)__ptr + lVar21 * 4) / (float)lVar16;
              lVar21 = lVar21 + 1;
            } while (lVar6 != lVar21);
          }
          prVar8 = expTable;
          prVar5 = syn1;
          pvVar7 = vocab;
          if ((hs != 0) && (cVar1 = vocab[lVar15].codelen, 0 < (long)cVar1)) {
            piVar2 = vocab[lVar15].point;
            lVar16 = 0;
            do {
              lVar21 = piVar2[lVar16] * lVar6;
              if (lVar6 < 1) {
                fVar30 = 0.0;
              }
              else {
                fVar30 = 0.0;
                lVar23 = 0;
                do {
                  fVar30 = fVar30 + *(float *)((long)__ptr + lVar23 * 4) * prVar5[lVar21 + lVar23];
                  lVar23 = lVar23 + 1;
                } while (lVar6 != lVar23);
              }
              if ((ABS(fVar30) < 6.0) && (0 < lVar6)) {
                fVar30 = ((float)(1 - pvVar7[lVar15].code[lVar16]) -
                         prVar8[(int)((fVar30 + 6.0) * 83.0)]) * alpha;
                lVar23 = 0;
                do {
                  *(float *)((long)__ptr_00 + lVar23 * 4) =
                       prVar5[lVar21 + lVar23] * fVar30 + *(float *)((long)__ptr_00 + lVar23 * 4);
                  lVar23 = lVar23 + 1;
                } while (lVar6 != lVar23);
                if (0 < lVar6) {
                  lVar23 = 0;
                  do {
                    prVar5[lVar21 + lVar23] =
                         *(float *)((long)__ptr + lVar23 * 4) * fVar30 + prVar5[lVar21 + lVar23];
                    lVar23 = lVar23 + 1;
                  } while (lVar6 != lVar23);
                }
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 != cVar1);
          }
          prVar9 = expTable;
          prVar8 = syn1neg;
          piVar2 = table;
          uVar19 = (ulong)(uint)negative;
          prVar5 = syn0;
          if (0 < negative) {
            uVar24 = vocab_size - 1;
            lVar16 = 0;
            do {
              if (lVar16 == 0) {
                iVar11 = 1;
                lVar21 = lVar15;
LAB_00103c32:
                lVar21 = lVar21 * lVar6;
                fVar30 = 0.0;
                if (lVar6 < 1) {
LAB_00103c7a:
                  fVar30 = (float)iVar11 - prVar9[(int)((fVar30 + 6.0) * 83.0)];
                }
                else {
                  lVar23 = 0;
                  fVar30 = 0.0;
                  do {
                    fVar30 = fVar30 + *(float *)((long)__ptr + lVar23 * 4) * prVar8[lVar21 + lVar23]
                    ;
                    lVar23 = lVar23 + 1;
                  } while (lVar6 != lVar23);
                  if (fVar30 <= 6.0) {
                    if (-6.0 <= fVar30) goto LAB_00103c7a;
                  }
                  else {
                    iVar11 = iVar11 + -1;
                  }
                  fVar30 = (float)iVar11;
                }
                fVar30 = fVar30 * alpha;
                if (0 < lVar6) {
                  lVar23 = 0;
                  do {
                    *(float *)((long)__ptr_00 + lVar23 * 4) =
                         prVar8[lVar21 + lVar23] * fVar30 + *(float *)((long)__ptr_00 + lVar23 * 4);
                    lVar23 = lVar23 + 1;
                  } while (lVar6 != lVar23);
                  if (0 < lVar6) {
                    lVar23 = 0;
                    do {
                      prVar8[lVar21 + lVar23] =
                           *(float *)((long)__ptr + lVar23 * 4) * fVar30 + prVar8[lVar21 + lVar23];
                      lVar23 = lVar23 + 1;
                    } while (lVar6 != lVar23);
                  }
                }
              }
              else {
                pvVar29 = (void *)((long)pvVar29 * 0x5deece66d + 0xb);
                auVar3._8_8_ = 0;
                auVar3._0_8_ = (ulong)pvVar29 >> 0x10;
                lVar21 = (long)piVar2[(int)((ulong)pvVar29 >> 0x10) +
                                      (SUB164(auVar3 * ZEXT816(0x55e63b88c231),8) >> 9) * -100000000
                                     ];
                if (lVar21 == 0) {
                  lVar21 = (ulong)pvVar29 % uVar24 + 1;
                }
                if (lVar21 != lVar15) {
                  iVar11 = 0;
                  goto LAB_00103c32;
                }
              }
              lVar16 = lVar16 + 1;
              prVar5 = syn0;
            } while (lVar16 != uVar19 + 1);
          }
          for (; prVar8 = syn0, syn0 = prVar5, (long)uVar18 < lVar22; uVar18 = uVar18 + 1) {
            if ((((uVar18 != uVar25) && (lVar15 = uVar18 + (lVar20 - uVar25), -1 < lVar15)) &&
                (lVar15 < lVar13)) && (alStack_1f78[lVar15] != -1 && 0 < lVar6)) {
              lVar15 = alStack_1f78[lVar15] * lVar6;
              lVar16 = 0;
              do {
                prVar8[lVar15 + lVar16] =
                     *(float *)((long)__ptr_00 + lVar16 * 4) + prVar8[lVar15 + lVar16];
                lVar16 = lVar16 + 1;
              } while (lVar6 != lVar16);
            }
            prVar5 = syn0;
            syn0 = prVar8;
          }
        }
      }
      lVar20 = lVar20 + 1;
      if (lVar13 <= lVar20) {
        lVar13 = 0;
      }
    }
  } while( true );
  word_count_actual = word_count_actual + (lVar28 - local_1fd8);
  local_1fc8 = local_1fc8 + -1;
  if (local_1fc8 == 0) {
    fclose(__stream);
    free(__ptr);
    free(__ptr_00);
    pthread_exit((void *)0x0);
  }
  lVar13 = file_size / (long)num_threads;
  goto LAB_0010361f;
}

Assistant:

void *TrainModelThread(void *id) {
  long long a, b, d, cw, word, last_word, sentence_length = 0, sentence_position = 0;
  long long word_count = 0, last_word_count = 0, sen[MAX_SENTENCE_LENGTH + 1];
  long long l1, l2, c, target, label, local_iter = iter;
  unsigned long long next_random = (long long)id;
  real f, g;
  clock_t now;
  real *neu1 = (real *)calloc(layer1_size, sizeof(real));
  real *neu1e = (real *)calloc(layer1_size, sizeof(real));
    printf("Opening train file %s\n", train_file);
  FILE *fi = fopen(train_file, "rb");
  if (fi == NULL) {
    fprintf(stderr, "no such file or directory: %s", train_file);
    exit(1);
  }
  if (num_threads > 1) {
    fseek(fi, file_size / (long long)num_threads * (long long)id, SEEK_SET);
  }
  while (1) {
    if (word_count - last_word_count > 10000) {
      word_count_actual += word_count - last_word_count;
      last_word_count = word_count;
      if ((debug_mode > 1)) {
        now=clock();
        printf("%cAlpha: %f  Progress: %.2f%%  Words/thread/sec: %.2fk  ", 13, alpha,
         word_count_actual / (real)(iter * train_words + 1) * 100,
         word_count_actual / ((real)(now - start + 1) / (real)CLOCKS_PER_SEC * 1000));
        fflush(stdout);
      }
      alpha = starting_alpha * (1 - word_count_actual / (real)(iter * train_words + 1));
      if (alpha < starting_alpha * 0.0001) alpha = starting_alpha * 0.0001;
    }
    if (sentence_length == 0) {
      while (1) {
        word = ReadWordIndex(fi);
        if (feof(fi)) break;
        if (word == -1) continue;
        word_count++;
        if (word == 0) break;
        // The subsampling randomly discards frequent words while keeping the ranking same
        if (sample > 0) {
          real ran = (sqrt(vocab[word].cn / (sample * train_words)) + 1) * (sample * train_words) / vocab[word].cn;
          next_random = next_random * (unsigned long long)25214903917 + 11;
          if (ran < (next_random & 0xFFFF) / (real)65536) continue;
        }
        sen[sentence_length] = word;
        sentence_length++;
        if (sentence_length >= MAX_SENTENCE_LENGTH) break;
      }
      sentence_position = 0;
    }
    if (feof(fi) || (word_count > train_words / num_threads)) {
      word_count_actual += word_count - last_word_count;
      local_iter--;
      if (local_iter == 0) break;
      word_count = 0;
      last_word_count = 0;
      sentence_length = 0;
      fseek(fi, file_size / (long long)num_threads * (long long)id, SEEK_SET);
      continue;
    }
    word = sen[sentence_position];
    if (word == -1) continue;
    for (c = 0; c < layer1_size; c++) neu1[c] = 0;
    for (c = 0; c < layer1_size; c++) neu1e[c] = 0;
    next_random = next_random * (unsigned long long)25214903917 + 11;
    b = next_random % window;
    if (cbow) {  //train the cbow architecture
      // in -> hidden
      cw = 0;
      for (a = b; a < window * 2 + 1 - b; a++) if (a != window) {
        c = sentence_position - window + a;
        if (c < 0) continue;
        if (c >= sentence_length) continue;
        last_word = sen[c];
        if (last_word == -1) continue;
        for (c = 0; c < layer1_size; c++) neu1[c] += syn0[c + last_word * layer1_size];
        cw++;
      }
      if (cw) {
        for (c = 0; c < layer1_size; c++) neu1[c] /= cw;
        if (hs) for (d = 0; d < vocab[word].codelen; d++) {
          f = 0;
          l2 = vocab[word].point[d] * layer1_size;
          // Propagate hidden -> output
          for (c = 0; c < layer1_size; c++) f += neu1[c] * syn1[c + l2];
          if (f <= -MAX_EXP) continue;
          else if (f >= MAX_EXP) continue;
          else f = expTable[(int)((f + MAX_EXP) * (EXP_TABLE_SIZE / MAX_EXP / 2))];
          // 'g' is the gradient multiplied by the learning rate
          g = (1 - vocab[word].code[d] - f) * alpha;
          // Propagate errors output -> hidden
          for (c = 0; c < layer1_size; c++) neu1e[c] += g * syn1[c + l2];
          // Learn weights hidden -> output
          for (c = 0; c < layer1_size; c++) syn1[c + l2] += g * neu1[c];
        }
        // NEGATIVE SAMPLING
        if (negative > 0) for (d = 0; d < negative + 1; d++) {
          if (d == 0) {
            target = word;
            label = 1;
          } else {
            next_random = next_random * (unsigned long long)25214903917 + 11;
            target = table[(next_random >> 16) % table_size];
            if (target == 0) target = next_random % (vocab_size - 1) + 1;
            if (target == word) continue;
            label = 0;
          }
          l2 = target * layer1_size;
          f = 0;
          for (c = 0; c < layer1_size; c++) f += neu1[c] * syn1neg[c + l2];
          if (f > MAX_EXP) g = (label - 1) * alpha;
          else if (f < -MAX_EXP) g = (label - 0) * alpha;
          else g = (label - expTable[(int)((f + MAX_EXP) * (EXP_TABLE_SIZE / MAX_EXP / 2))]) * alpha;
          for (c = 0; c < layer1_size; c++) neu1e[c] += g * syn1neg[c + l2];
          for (c = 0; c < layer1_size; c++) syn1neg[c + l2] += g * neu1[c];
        }
        // hidden -> in
        for (a = b; a < window * 2 + 1 - b; a++) if (a != window) {
          c = sentence_position - window + a;
          if (c < 0) continue;
          if (c >= sentence_length) continue;
          last_word = sen[c];
          if (last_word == -1) continue;
          for (c = 0; c < layer1_size; c++) syn0[c + last_word * layer1_size] += neu1e[c];
        }
      }
    } else {  //train skip-gram
      for (a = b; a < window * 2 + 1 - b; a++) if (a != window) {
        c = sentence_position - window + a;
        if (c < 0) continue;
        if (c >= sentence_length) continue;
        last_word = sen[c];
        if (last_word == -1) continue;
        l1 = last_word * layer1_size;
        for (c = 0; c < layer1_size; c++) neu1e[c] = 0;
        // HIERARCHICAL SOFTMAX
        if (hs) for (d = 0; d < vocab[word].codelen; d++) {
          f = 0;
          l2 = vocab[word].point[d] * layer1_size;
          // Propagate hidden -> output
          for (c = 0; c < layer1_size; c++) f += syn0[c + l1] * syn1[c + l2];
          if (f <= -MAX_EXP) continue;
          else if (f >= MAX_EXP) continue;
          else f = expTable[(int)((f + MAX_EXP) * (EXP_TABLE_SIZE / MAX_EXP / 2))];
          // 'g' is the gradient multiplied by the learning rate
          g = (1 - vocab[word].code[d] - f) * alpha;
          // Propagate errors output -> hidden
          for (c = 0; c < layer1_size; c++) neu1e[c] += g * syn1[c + l2];
          // Learn weights hidden -> output
          for (c = 0; c < layer1_size; c++) syn1[c + l2] += g * syn0[c + l1];
        }
        // NEGATIVE SAMPLING
        if (negative > 0) for (d = 0; d < negative + 1; d++) {
          if (d == 0) {
            target = word;
            label = 1;
          } else {
            next_random = next_random * (unsigned long long)25214903917 + 11;
            target = table[(next_random >> 16) % table_size];
            if (target == 0) target = next_random % (vocab_size - 1) + 1;
            if (target == word) continue;
            label = 0;
          }
          l2 = target * layer1_size;
          f = 0;
          for (c = 0; c < layer1_size; c++) f += syn0[c + l1] * syn1neg[c + l2];
          if (f > MAX_EXP) g = (label - 1) * alpha;
          else if (f < -MAX_EXP) g = (label - 0) * alpha;
          else g = (label - expTable[(int)((f + MAX_EXP) * (EXP_TABLE_SIZE / MAX_EXP / 2))]) * alpha;
          for (c = 0; c < layer1_size; c++) neu1e[c] += g * syn1neg[c + l2];
          for (c = 0; c < layer1_size; c++) syn1neg[c + l2] += g * syn0[c + l1];
        }
        // Learn weights input -> hidden
        for (c = 0; c < layer1_size; c++) syn0[c + l1] += neu1e[c];
      }
    }
    sentence_position++;
    if (sentence_position >= sentence_length) {
      sentence_length = 0;
      continue;
    }
  }
  fclose(fi);
  free(neu1);
  free(neu1e);
  pthread_exit(NULL);
}